

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

void searchCurrencyName(CurrencyNameStruct *currencyNames,int32_t total_currency_count,UChar *text,
                       int32_t textLen,int32_t *partialMatchLen,int32_t *maxMatchLen,
                       int32_t *maxMatchIndex)

{
  ulong uVar1;
  UChar UVar2;
  UChar *pUVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  *maxMatchIndex = -1;
  *maxMatchLen = 0;
  iVar12 = total_currency_count + -1;
  uVar4 = 0;
  if (0 < textLen) {
    uVar4 = (ulong)(uint)textLen;
  }
  iVar7 = 0;
  uVar5 = 0;
LAB_002aedbe:
  if (uVar5 == uVar4) {
    return;
  }
  if (iVar12 < iVar7) {
    return;
  }
  UVar2 = text[uVar5];
  iVar10 = iVar7;
  iVar11 = iVar12;
  do {
    iVar9 = (iVar11 + iVar10) / 2;
    if (((long)uVar5 < (long)currencyNames[iVar9].currencyNameLen) &&
       ((ushort)UVar2 <= (ushort)currencyNames[iVar9].currencyName[uVar5])) {
      if ((ushort)currencyNames[iVar9].currencyName[uVar5] <= (ushort)UVar2) break;
      iVar11 = iVar9 + -1;
    }
    else {
      iVar10 = iVar9 + 1;
    }
    if (iVar11 < iVar10) {
      return;
    }
  } while( true );
  iVar10 = iVar9;
  if (iVar7 < iVar9) {
    do {
      iVar11 = (iVar7 + iVar10) / 2;
      if (((long)currencyNames[iVar11].currencyNameLen <= (long)uVar5) ||
         ((ushort)currencyNames[iVar11].currencyName[uVar5] < (ushort)UVar2)) {
        iVar7 = iVar11 + 1;
        iVar11 = iVar10;
      }
      iVar10 = iVar11;
    } while (iVar7 < iVar11);
  }
  while (iVar10 = iVar12, iVar9 < iVar10) {
    iVar12 = (iVar9 + iVar10) / 2;
    if (((long)currencyNames[iVar12].currencyNameLen < (long)uVar5) ||
       ((ushort)currencyNames[iVar12].currencyName[uVar5] <= (ushort)UVar2)) {
      iVar9 = iVar12 + 1;
      iVar12 = iVar10;
    }
  }
  iVar12 = iVar10 - (uint)((ushort)UVar2 < (ushort)currencyNames[iVar10].currencyName[uVar5]);
  lVar8 = (long)iVar7;
  uVar1 = uVar5 + 1;
  iVar10 = -1;
  if (uVar1 == (uint)currencyNames[lVar8].currencyNameLen) {
    iVar10 = iVar7;
  }
  if (iVar7 == -1) {
    return;
  }
  iVar11 = (int)uVar1;
  if ((long)uVar5 < (long)*partialMatchLen) {
    iVar11 = *partialMatchLen;
  }
  *partialMatchLen = iVar11;
  if (iVar10 != -1) {
    *maxMatchLen = (int)uVar1;
    *maxMatchIndex = iVar10;
  }
  uVar5 = uVar1;
  if (iVar12 - iVar7 < 10) {
    if (iVar7 <= iVar12) {
      iVar7 = *partialMatchLen;
      do {
        iVar10 = currencyNames[lVar8].currencyNameLen;
        if (((textLen < iVar10) || (iVar10 <= *maxMatchLen)) ||
           (iVar11 = bcmp(currencyNames[lVar8].currencyName,text,(long)iVar10 * 2), iVar11 != 0)) {
          if (textLen <= iVar10) {
            iVar10 = textLen;
          }
          if (iVar7 < iVar10) {
            pUVar3 = currencyNames[lVar8].currencyName;
            lVar6 = (long)iVar7;
            iVar11 = iVar7;
            do {
              iVar11 = iVar11 + 1;
              if (pUVar3[lVar6] != text[lVar6]) break;
              iVar9 = iVar11;
              if (lVar6 < *partialMatchLen) {
                iVar9 = *partialMatchLen;
              }
              lVar6 = lVar6 + 1;
              *partialMatchLen = iVar9;
            } while ((1 - iVar10) + iVar11 != 1);
          }
        }
        else {
          iVar11 = *partialMatchLen;
          if (*partialMatchLen <= iVar10) {
            iVar11 = iVar10;
          }
          *partialMatchLen = iVar11;
          *maxMatchIndex = (int32_t)lVar8;
          *maxMatchLen = iVar10;
        }
        lVar8 = lVar8 + 1;
      } while (iVar12 + 1 != (int)lVar8);
    }
    return;
  }
  goto LAB_002aedbe;
}

Assistant:

static void
searchCurrencyName(const CurrencyNameStruct* currencyNames, 
                   int32_t total_currency_count,
                   const UChar* text, int32_t textLen,
                   int32_t *partialMatchLen,
                   int32_t* maxMatchLen, int32_t* maxMatchIndex) {
    *maxMatchIndex = -1;
    *maxMatchLen = 0;
    int32_t matchIndex = -1;
    int32_t binarySearchBegin = 0;
    int32_t binarySearchEnd = total_currency_count - 1;
    // It is a variant of binary search.
    // For example, given the currency names in currencyNames array are:
    // A AB ABC AD AZ B BB BBEX BBEXYZ BS C D E....
    // and the input text is BBEXST
    // The first round binary search search "B" in the text against
    // the first char in currency names, and find the first char matching range
    // to be "B BB BBEX BBEXYZ BS" (and the maximum matching "B").
    // The 2nd round binary search search the second "B" in the text against
    // the 2nd char in currency names, and narrow the matching range to
    // "BB BBEX BBEXYZ" (and the maximum matching "BB").
    // The 3rd round returnes the range as "BBEX BBEXYZ" (without changing
    // maximum matching).
    // The 4th round returns the same range (the maximum matching is "BBEX").
    // The 5th round returns no matching range.
    for (int32_t index = 0; index < textLen; ++index) {
        // matchIndex saves the one with exact match till the current point.
        // [binarySearchBegin, binarySearchEnd] saves the matching range.
        matchIndex = binarySearch(currencyNames, index,
                                  text[index],
                                  &binarySearchBegin, &binarySearchEnd);
        if (binarySearchBegin == -1) { // did not find the range
            break;
        }
        *partialMatchLen = MAX(*partialMatchLen, index + 1);
        if (matchIndex != -1) { 
            // find an exact match for text from text[0] to text[index] 
            // in currencyNames array.
            *maxMatchLen = index + 1;
            *maxMatchIndex = matchIndex;
        }
        if (binarySearchEnd - binarySearchBegin < LINEAR_SEARCH_THRESHOLD) {
            // linear search if within threshold.
            linearSearch(currencyNames, binarySearchBegin, binarySearchEnd,
                         text, textLen,
                         partialMatchLen,
                         maxMatchLen, maxMatchIndex);
            break;
        }
    }
    return;
}